

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

void buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(Model *m)

{
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  NeuralNetworkLayer *softmaxLayer;
  NeuralNetwork *nn;
  Model *m_local;
  
  this = buildBasicUpdatableNeuralNetworkModel(m);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(this_00,"softmax");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"softmax_out");
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(this_00);
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (m,this,"cross_entropy_loss_layer","softmax_out","label_target");
  return;
}

Assistant:

void buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(Specification::Model& m) {

    auto *nn = buildBasicUpdatableNeuralNetworkModel(m);

    // set a softmax layer
    auto softmaxLayer = nn->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("B");
    softmaxLayer->add_output("softmax_out");
    softmaxLayer->mutable_softmax();

    addCategoricalCrossEntropyLoss(m, nn, "cross_entropy_loss_layer", "softmax_out", "label_target");
}